

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

BranchInstr * __thiscall IR::Instr::ChangeCmCCToBranchInstr(Instr *this,LabelInstr *targetInstr)

{
  code *pcVar1;
  bool bVar2;
  OpCode opcode;
  undefined4 *puVar3;
  BranchInstr *instr;
  Opnd *pOVar4;
  
  switch(this->m_opcode) {
  case CmUnGe_A:
    opcode = BrUnGe_A;
    break;
  case CmUnGt_A:
    opcode = BrUnGt_A;
    break;
  case CmUnLt_A:
    opcode = BrUnLt_A;
    break;
  case CmUnLe_A:
    opcode = BrUnLe_A;
    break;
  case CmEq_I4:
    opcode = BrEq_I4;
    break;
  case CmNeq_I4:
    opcode = BrNeq_I4;
    break;
  case CmLt_I4:
    opcode = BrLt_I4;
    break;
  case CmLe_I4:
    opcode = BrLe_I4;
    break;
  case CmGt_I4:
    opcode = BrGt_I4;
    break;
  case CmGe_I4:
    opcode = BrGe_I4;
    break;
  case CmUnLt_I4:
    opcode = BrUnLt_I4;
    break;
  case CmUnLe_I4:
    opcode = BrUnLe_I4;
    break;
  case CmUnGt_I4:
    opcode = BrUnGt_I4;
    break;
  case CmUnGe_I4:
    opcode = BrUnGe_I4;
    break;
  default:
    switch(this->m_opcode) {
    case CmEq_A:
      opcode = BrEq_A;
      break;
    case CmGe_A:
      opcode = BrGe_A;
      break;
    case CmGt_A:
      opcode = BrGt_A;
      break;
    case CmLt_A:
      opcode = BrLt_A;
      break;
    case CmLe_A:
      opcode = BrLe_A;
      break;
    case CmNeq_A:
      opcode = BrNeq_A;
      break;
    case CmSrEq_A:
      opcode = BrSrEq_A;
      break;
    case CmSrNeq_A:
      opcode = BrSrNeq_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xf50,"((0))","UNREACHED");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      opcode = InvalidOpCode;
    }
  }
  instr = BranchInstr::New(opcode,targetInstr,this->m_func);
  InsertBefore(this,&instr->super_Instr);
  SetByteCodeOffset(&instr->super_Instr,this);
  pOVar4 = UnlinkSrc1(this);
  SetSrc1(&instr->super_Instr,pOVar4);
  pOVar4 = UnlinkSrc2(this);
  SetSrc2(&instr->super_Instr,pOVar4);
  Remove(this);
  return instr;
}

Assistant:

BranchInstr *
Instr::ChangeCmCCToBranchInstr(LabelInstr *targetInstr)
{
    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;
    switch (this->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    BranchInstr *instrBr = BranchInstr::New(newOpcode, targetInstr, this->m_func);
    this->InsertBefore(instrBr);
    instrBr->SetByteCodeOffset(this);
    instrBr->SetSrc1(this->UnlinkSrc1());
    instrBr->SetSrc2(this->UnlinkSrc2());

    this->Remove();

    return instrBr;
}